

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
Arithmetic_UnaryOperations_Test::Arithmetic_UnaryOperations_Test
          (Arithmetic_UnaryOperations_Test *this)

{
  Arithmetic_UnaryOperations_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Arithmetic_UnaryOperations_Test_00243c80;
  return;
}

Assistant:

TEST(Arithmetic, UnaryOperations) {
	MockParser mock(
		"let a = 3\n"
		"let b = -a\n"
		"let c = --a\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS(BC_NEG, 1, 0, 0);
	INS(BC_NEG, 2, 0, 0);
	INS(BC_NEG, 2, 2, 0);
	INS(BC_RET, 0, 0, 0);
}